

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int clearDatabasePage(BtShared *pBt,Pgno pgno,int freePageFlag,i64 *pnChange)

{
  BtShared *pBt_00;
  Pgno PVar1;
  int iVar2;
  u32 uVar3;
  u8 *p;
  undefined1 local_60 [8];
  CellInfo info;
  int hdr;
  int i;
  uchar *pCell;
  MemPage *pMStack_30;
  int rc;
  MemPage *pPage;
  i64 *pnChange_local;
  int freePageFlag_local;
  Pgno pgno_local;
  BtShared *pBt_local;
  
  pPage = (MemPage *)pnChange;
  pnChange_local._0_4_ = freePageFlag;
  pnChange_local._4_4_ = pgno;
  _freePageFlag_local = pBt;
  PVar1 = btreePagecount(pBt);
  if (PVar1 < pgno) {
    iVar2 = sqlite3CorruptError(0x12b7a);
    return iVar2;
  }
  pCell._4_4_ = getAndInitPage(_freePageFlag_local,pnChange_local._4_4_,&stack0xffffffffffffffd0,
                               (BtCursor *)0x0,0);
  if (pCell._4_4_ != 0) {
    return pCell._4_4_;
  }
  if (((_freePageFlag_local->openFlags & 4) == 0) &&
     (iVar2 = sqlite3PagerPageRefcount(pMStack_30->pDbPage),
     iVar2 != (pnChange_local._4_4_ == 1) + 1)) {
    pCell._4_4_ = sqlite3CorruptError(0x12b81);
  }
  else {
    info.nPayload = (u32)pMStack_30->hdrOffset;
    info.nLocal = 0;
    info.nSize = 0;
    for (; pBt_00 = _freePageFlag_local, (int)info._20_4_ < (int)(uint)pMStack_30->nCell;
        info._20_4_ = info._20_4_ + 1) {
      p = pMStack_30->aData +
          (int)(uint)(pMStack_30->maskPage &
                     CONCAT11(pMStack_30->aCellIdx[(int)(info._20_4_ << 1)],
                              pMStack_30->aCellIdx[(long)(int)(info._20_4_ << 1) + 1]));
      if (pMStack_30->leaf == '\0') {
        uVar3 = sqlite3Get4byte(p);
        pCell._4_4_ = clearDatabasePage(pBt_00,uVar3,1,(i64 *)pPage);
        if (pCell._4_4_ != 0) goto LAB_001673a8;
        pCell._4_4_ = 0;
      }
      (*pMStack_30->xParseCell)(pMStack_30,p,(CellInfo *)local_60);
      if (info.pPayload._4_2_ == (uint)info.pPayload) {
        pCell._4_4_ = 0;
      }
      else {
        pCell._4_4_ = clearCellOverflow(pMStack_30,p,(CellInfo *)local_60);
      }
      if (pCell._4_4_ != 0) goto LAB_001673a8;
    }
    if (pMStack_30->leaf == '\0') {
      uVar3 = sqlite3Get4byte(pMStack_30->aData + (int)(info.nPayload + 8));
      pCell._4_4_ = clearDatabasePage(pBt_00,uVar3,1,(i64 *)pPage);
      if (pCell._4_4_ != 0) goto LAB_001673a8;
      if (pMStack_30->intKey != '\0') {
        pPage = (MemPage *)0x0;
      }
    }
    if (pPage != (MemPage *)0x0) {
      *(ulong *)pPage = (ulong)pMStack_30->nCell + *(long *)pPage;
    }
    if ((int)pnChange_local == 0) {
      pCell._4_4_ = sqlite3PagerWrite(pMStack_30->pDbPage);
      if (pCell._4_4_ == 0) {
        zeroPage(pMStack_30,pMStack_30->aData[(int)info.nPayload] | 8);
      }
    }
    else {
      freePage(pMStack_30,(int *)((long)&pCell + 4));
    }
  }
LAB_001673a8:
  releasePage(pMStack_30);
  return pCell._4_4_;
}

Assistant:

static int clearDatabasePage(
  BtShared *pBt,           /* The BTree that contains the table */
  Pgno pgno,               /* Page number to clear */
  int freePageFlag,        /* Deallocate page if true */
  i64 *pnChange            /* Add number of Cells freed to this counter */
){
  MemPage *pPage;
  int rc;
  unsigned char *pCell;
  int i;
  int hdr;
  CellInfo info;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }
  rc = getAndInitPage(pBt, pgno, &pPage, 0, 0);
  if( rc ) return rc;
  if( (pBt->openFlags & BTREE_SINGLE)==0
   && sqlite3PagerPageRefcount(pPage->pDbPage) != (1 + (pgno==1))
  ){
    rc = SQLITE_CORRUPT_BKPT;
    goto cleardatabasepage_out;
  }
  hdr = pPage->hdrOffset;
  for(i=0; i<pPage->nCell; i++){
    pCell = findCell(pPage, i);
    if( !pPage->leaf ){
      rc = clearDatabasePage(pBt, get4byte(pCell), 1, pnChange);
      if( rc ) goto cleardatabasepage_out;
    }
    BTREE_CLEAR_CELL(rc, pPage, pCell, info);
    if( rc ) goto cleardatabasepage_out;
  }
  if( !pPage->leaf ){
    rc = clearDatabasePage(pBt, get4byte(&pPage->aData[hdr+8]), 1, pnChange);
    if( rc ) goto cleardatabasepage_out;
    if( pPage->intKey ) pnChange = 0;
  }
  if( pnChange ){
    testcase( !pPage->intKey );
    *pnChange += pPage->nCell;
  }
  if( freePageFlag ){
    freePage(pPage, &rc);
  }else if( (rc = sqlite3PagerWrite(pPage->pDbPage))==0 ){
    zeroPage(pPage, pPage->aData[hdr] | PTF_LEAF);
  }

cleardatabasepage_out:
  releasePage(pPage);
  return rc;
}